

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O0

void tf::throw_re<char_const(&)[41]>(char *fname,size_t line,char (*args) [41])

{
  ostream *poVar1;
  runtime_error *this;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  ostringstream oss;
  string local_1c0 [48];
  ostream local_190;
  char *local_18;
  ulong local_10;
  char *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  poVar1 = std::operator<<(&local_190,"[");
  poVar1 = std::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
  std::operator<<(poVar1,"] ");
  std::operator<<(&local_190,local_18);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_1c0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_re(const char* fname, const size_t line, ArgsT&&... args) {
  std::ostringstream oss;
  oss << "[" << fname << ":" << line << "] ";
  //ostreamize(oss, std::forward<ArgsT>(args)...);
  (oss << ... << args);
#ifdef TF_DISABLE_EXCEPTION_HANDLING
  std::cerr << oss.str();
  std::terminate();
#else
  throw std::runtime_error(oss.str());
#endif
}